

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O1

LoopFlags __thiscall BVFixed::GetRange<Js::LoopFlags>(BVFixed *this,BVIndex start,BVIndex len)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  sbyte sVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64 flags;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  BVIndex i;
  LoopFlags local_29;
  
  AssertRange(this,start);
  if (len == 0) {
    local_29 = (LoopFlags)0x0;
  }
  else {
    if (8 < len) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                         ,0xb7,"(len <= sizeof(Container) * MachBits)",
                         "len <= sizeof(Container) * MachBits");
      if (!bVar2) goto LAB_0057406b;
      *puVar4 = 0;
    }
    if (0x40 < len) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                         ,0xb8,"(len <= 64)","Currently doesn\'t support range bigger than 64 bits")
      ;
      if (!bVar2) {
LAB_0057406b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    i = (len + start) - 1;
    AssertRange(this,i);
    uVar7 = start >> 6;
    uVar8 = (ulong)uVar7;
    uVar3 = i >> 6;
    uVar12 = start & 0x3f;
    uVar9 = ~(-1L << ((char)(i & 0x3f) + 1U & 0x3f));
    if ((i & 0x3f) == 0x3f) {
      uVar9 = 0xffffffffffffffff;
    }
    sVar5 = (sbyte)uVar12;
    if (uVar7 == uVar3) {
      flags = (uVar9 & (ulong)this[(ulong)uVar7 + 1]) >> sVar5;
    }
    else if (uVar7 + 1 == uVar3) {
      flags = (ulong)this[(ulong)uVar7 + 1] >> sVar5 |
              (uVar9 & (ulong)this[(ulong)uVar3 + 1]) << 0x40 - sVar5;
    }
    else {
      uVar10 = (ulong)this[(ulong)uVar7 + 1] >> sVar5;
      iVar6 = 0x40 - uVar12;
      bVar11 = (byte)iVar6;
      if (uVar7 + 1 < uVar3) {
        do {
          uVar10 = uVar10 | (long)this[uVar8 + 2] << ((byte)iVar6 & 0x3f);
          iVar6 = iVar6 + 0x40;
          uVar12 = uVar12 - 0x40;
          uVar8 = uVar8 + 1;
        } while ((ulong)uVar3 - 1 != uVar8);
        bVar11 = -(char)uVar12;
      }
      flags = (uVar9 & (ulong)this[(ulong)uVar3 + 1]) << (bVar11 & 0x3f) | uVar10;
    }
    Js::LoopFlags::LoopFlags(&local_29,flags);
  }
  return local_29;
}

Assistant:

Container BVFixed::GetRange(BVIndex start, BVIndex len) const
{
    AssertRange(start);
    if (len == 0)
    {
        return Container(0);
    }
    Assert(len <= sizeof(Container) * MachBits);
    AssertMsg(len <= 64, "Currently doesn't support range bigger than 64 bits");
    BVIndex end = start + len - 1;
    AssertRange(end);
    BVIndex iStart = BVUnit::Position(start);
    BVIndex iEnd = BVUnit::Position(end);
    BVIndex oStart = BVUnit::Offset(start);
    BVIndex oEnd = BVUnit::Offset(end);
    // Simply using uint64 because it is much easier than to juggle with BVUnit::BVUnitTContainer's size
    // Special case, if oEnd == 63, 1 << 64 == 1. Therefore the result is incorrect
    uint64 mask = oEnd < 63 ? (((uint64)1 << (oEnd + 1)) - 1) : 0xFFFFFFFFFFFFFFFF;
    uint64 range;
    // Trivial case
    if (iStart == iEnd)
    {
        // remove the bits after oEnd with mask, then remove the bits before start with shift
        range = (mask & this->data[iStart].GetWord()) >> oStart;
    }
    // Still simple enough
    else if (iStart + 1 == iEnd)
    {
        auto startWord = this->data[iStart].GetWord();
        auto endWord = this->data[iEnd].GetWord();
        // remove the bits before start with shift
        range = startWord >> oStart;
        // remove the bits after oEnd with mask then position it after start bits
        range |= (mask & endWord) << (BVUnit::BitsPerWord - oStart);
    }
    // Spans over multiple value, need to loop
    else
    {
        // Get the first bits and move them to the beginning
        range = this->data[iStart].GetWord() >> oStart;
        // track how many bits have been read so far
        int nBitsUsed = BVUnit::BitsPerWord - oStart;
        for (uint i = iStart + 1; i < iEnd; ++i)
        {
            // put all bits from the data in the mid-range. Use the tracked read bits to position them
            range |= ((uint64)(this->data[i].GetWord())) << nBitsUsed;
            nBitsUsed += BVUnit::BitsPerWord;
        }
        // Read the last bits and remove those after oEnd with mask
        range |= (mask & this->data[iEnd].GetWord()) << nBitsUsed;
    }
    return Container(range);
}